

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

int BaseSocketImpl::EnumIpAddresses
              (function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
               *fnCallBack,void *vpUser)

{
  int iVar1;
  uint __args_2;
  socklen_t __salen;
  ifaddrs *piVar2;
  ifaddrs *lstAddr;
  string strAddrBuf;
  
  piVar2 = (ifaddrs *)&lstAddr;
  iVar1 = getifaddrs(piVar2);
  if (iVar1 == 0) {
    while (piVar2 = piVar2->ifa_next, piVar2 != (ifaddrs *)0x0) {
      if (((piVar2->ifa_addr != (sockaddr *)0x0) && ((piVar2->ifa_addr->sa_family | 8) == 10)) &&
         ((piVar2->ifa_flags & 9) == 1)) {
        strAddrBuf._M_dataplus._M_p = (pointer)&strAddrBuf.field_2;
        std::__cxx11::string::_M_construct((ulong)&strAddrBuf,'\x01');
        __salen = 0x1c;
        if (((sockaddr *)piVar2->ifa_addr)->sa_family == 2) {
          __salen = 0x10;
        }
        iVar1 = getnameinfo((sockaddr *)piVar2->ifa_addr,__salen,strAddrBuf._M_dataplus._M_p,
                            (socklen_t)strAddrBuf._M_string_length,(char *)0x0,0,1);
        if (iVar1 == 0) {
          __args_2 = if_nametoindex(piVar2->ifa_name);
          iVar1 = std::
                  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
                  ::operator()(fnCallBack,(uint)piVar2->ifa_addr->sa_family,&strAddrBuf,__args_2,
                               vpUser);
          if (iVar1 != 0) {
            freeifaddrs(lstAddr);
            std::__cxx11::string::~string((string *)&strAddrBuf);
            return 0x7d;
          }
        }
        std::__cxx11::string::~string((string *)&strAddrBuf);
      }
    }
    freeifaddrs(lstAddr);
  }
  return 0;
}

Assistant:

int BaseSocketImpl::EnumIpAddresses(function<int(int, const string&, int, void*)> fnCallBack, void* vpUser)
{
#if defined(_WIN32) || defined(_WIN64)
    ULONG outBufLen = sizeof(IP_ADAPTER_ADDRESSES_LH) * 255;
    auto pAddressList = make_unique<IP_ADAPTER_ADDRESSES_LH[]>(255);
    if (pAddressList == nullptr)
        return ERROR_OUTOFMEMORY;
    DWORD ret = GetAdaptersAddresses(AF_UNSPEC, GAA_FLAG_SKIP_ANYCAST | GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER, nullptr, &pAddressList[0], &outBufLen);

    if (ret == ERROR_BUFFER_OVERFLOW)
    {
        pAddressList = make_unique<IP_ADAPTER_ADDRESSES_LH[]>(outBufLen / sizeof(IP_ADAPTER_ADDRESSES_LH) + 1);
        if (pAddressList == nullptr)
            return ERROR_OUTOFMEMORY;
        ret = GetAdaptersAddresses(AF_UNSPEC, GAA_FLAG_SKIP_ANYCAST | GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER, nullptr, &pAddressList[0], &outBufLen);
    }

    if (ret == ERROR_SUCCESS)
    {
        for (PIP_ADAPTER_ADDRESSES pCurrentAddresses = &pAddressList[0]; pCurrentAddresses != nullptr; pCurrentAddresses = pCurrentAddresses->Next)
        {
            if (pCurrentAddresses->IfType == IF_TYPE_SOFTWARE_LOOPBACK || pCurrentAddresses->OperStatus != IfOperStatusUp)
                continue;

            for (PIP_ADAPTER_UNICAST_ADDRESS pUnicast = pCurrentAddresses->FirstUnicastAddress; pUnicast != nullptr; pUnicast = pUnicast->Next)
            {
                if ((pUnicast->Flags & IP_ADAPTER_ADDRESS_TRANSIENT) == IP_ADAPTER_ADDRESS_TRANSIENT)
                    continue;

                string strTmp(255, 0);
                if (pUnicast->Address.lpSockaddr->sa_family == AF_INET6)
                    strTmp = inet_ntop(AF_INET6, &reinterpret_cast<struct sockaddr_in6*>(pUnicast->Address.lpSockaddr)->sin6_addr, &strTmp[0], strTmp.size());
                else
                    strTmp = inet_ntop(AF_INET, &reinterpret_cast<struct sockaddr_in*>(pUnicast->Address.lpSockaddr)->sin_addr, &strTmp[0], strTmp.size());
                if (fnCallBack(pUnicast->Address.lpSockaddr->sa_family, strTmp, pCurrentAddresses->IfIndex, vpUser) != 0)
                {
                    return ERROR_CANCELLED;
                }
            }
        }
    }

#else
    int ret = 0;
    struct ifaddrs* lstAddr;
    if (getifaddrs(&lstAddr) == 0)
    {
        for (struct ifaddrs *ptr = lstAddr; ptr != nullptr; ptr = ptr->ifa_next)
        {
            if (ptr->ifa_addr == nullptr || (ptr->ifa_addr->sa_family != AF_INET && ptr->ifa_addr->sa_family != AF_INET6))
                continue;
            if ((ptr->ifa_flags & IFF_UP) == 0 || (ptr->ifa_flags & IFF_LOOPBACK) == IFF_LOOPBACK)
                continue;
            string strAddrBuf(NI_MAXHOST, 0);
            if (/*&& string(ptr->ifa_name).find("eth") != string::npos &&*/ getnameinfo(ptr->ifa_addr, (ptr->ifa_addr->sa_family == AF_INET) ? sizeof(struct sockaddr_in) : sizeof(struct sockaddr_in6), &strAddrBuf[0], strAddrBuf.size(), NULL, 0, NI_NUMERICHOST) == 0)
            {
                unsigned int iIfIndex = if_nametoindex(ptr->ifa_name);

                if (fnCallBack(ptr->ifa_addr->sa_family, strAddrBuf, iIfIndex, vpUser) != 0)
                {
                    freeifaddrs(lstAddr);
                    return ECANCELED;
                }
            }
        }

        freeifaddrs(lstAddr);
    }
#endif
    return ret;
}